

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadTagType(BinaryReader *this,Index *out_sig_index)

{
  bool bVar1;
  Result RVar2;
  uint8_t local_21;
  Index *pIStack_20;
  uint8_t attribute;
  Index *out_sig_index_local;
  BinaryReader *this_local;
  
  pIStack_20 = out_sig_index;
  out_sig_index_local = (Index *)this;
  RVar2 = ReadU8(this,&local_21,"tag attribute");
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if (local_21 == '\0') {
    RVar2 = ReadIndex(this,pIStack_20,"tag signature index");
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  else {
    PrintError(this,"tag attribute must be 0");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadTagType(Index* out_sig_index) {
  uint8_t attribute;
  CHECK_RESULT(ReadU8(&attribute, "tag attribute"));
  ERROR_UNLESS(attribute == 0, "tag attribute must be 0");
  CHECK_RESULT(ReadIndex(out_sig_index, "tag signature index"));
  return Result::Ok;
}